

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>
spdlog::details::
make_unique<spdlog::pattern_formatter,std::__cxx11::string_const&,spdlog::pattern_time_type_const&,std::__cxx11::string_const&,std::unordered_map<char,std::unique_ptr<spdlog::custom_flag_formatter,std::default_delete<spdlog::custom_flag_formatter>>,std::hash<char>,std::equal_to<char>,std::allocator<std::pair<char_const,std::unique_ptr<spdlog::custom_flag_formatter,std::default_delete<spdlog::custom_flag_formatter>>>>>>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          pattern_time_type *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
          unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
          *args_3)

{
  string *in_RCX;
  string *in_RSI;
  __uniq_ptr_data<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>,_true,_true>
  in_RDI;
  pointer in_stack_ffffffffffffff18;
  unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
  *this;
  custom_flags *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  pattern_time_type in_stack_ffffffffffffff84;
  string *in_stack_ffffffffffffff88;
  pattern_formatter *in_stack_ffffffffffffff90;
  string local_48 [40];
  string *local_20;
  string *local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  operator_new(0xe0);
  std::__cxx11::string::string(local_48,local_10);
  std::__cxx11::string::string((string *)&stack0xffffffffffffff88,local_20);
  this = (unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
          *)&stack0xffffffffffffff50;
  std::
  unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
  ::unordered_map(this,(unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
                        *)in_stack_ffffffffffffff18);
  pattern_formatter::pattern_formatter
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
             in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::unique_ptr<spdlog::pattern_formatter,std::default_delete<spdlog::pattern_formatter>>::
  unique_ptr<std::default_delete<spdlog::pattern_formatter>,void>
            ((unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>
              *)this,in_stack_ffffffffffffff18);
  std::
  unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
  ::~unordered_map((unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
                    *)0x1630e0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  std::__cxx11::string::~string(local_48);
  return (__uniq_ptr_data<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>,_true,_true>
          )(tuple<spdlog::pattern_formatter_*,_std::default_delete<spdlog::pattern_formatter>_>)
           in_RDI.
           super___uniq_ptr_impl<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>
           ._M_t.
           super__Tuple_impl<0UL,_spdlog::pattern_formatter_*,_std::default_delete<spdlog::pattern_formatter>_>
           .super__Head_base<0UL,_spdlog::pattern_formatter_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<T> make_unique(Args &&...args)
{
    static_assert(!std::is_array<T>::value, "arrays not supported");
    return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}